

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O2

void CS248::Viewer::drawError(void)

{
  ulong uVar1;
  byte bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  OSDText *pOVar6;
  int line_id;
  int line_id_00;
  int iVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar20 [16];
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  Color color;
  Color color_00;
  Color color_01;
  undefined1 auVar28 [16];
  string clickPrompt;
  string errorTitle;
  string local_90;
  string local_70;
  string local_50;
  undefined1 auVar11 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined8 uVar18;
  
  if (showingError == '\x01') {
    puts("Showing Error! *******************");
    glPushAttrib(0x800);
    glViewport(0,0,(undefined4)buffer_w,(undefined4)buffer_h);
    glMatrixMode(0x1701);
    glPushMatrix();
    glLoadIdentity();
    auVar28._4_4_ = buffer_w._4_4_;
    auVar28._0_4_ = (undefined4)buffer_w;
    auVar28._8_4_ = buffer_w._4_4_;
    auVar28._12_4_ = 0x45300000;
    auVar10._4_4_ = buffer_h._4_4_;
    auVar10._0_4_ = (undefined4)buffer_h;
    auVar10._8_4_ = buffer_h._4_4_;
    auVar10._12_4_ = 0x45300000;
    glOrtho(0,(auVar28._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(undefined4)buffer_w) - 4503599627370496.0),
            (auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(undefined4)buffer_h) - 4503599627370496.0),0,0,
            0x3ff0000000000000);
    glMatrixMode(0x1700);
    glPushMatrix();
    glLoadIdentity();
    glTranslatef(0,0,0xbf800000);
    glDisable(0xb71);
    glDisable(0xb50);
    errorTitle._M_dataplus._M_p = (pointer)&errorTitle.field_2;
    errorTitle._M_string_length = 0;
    clickPrompt._M_dataplus._M_p = (pointer)&clickPrompt.field_2;
    clickPrompt._M_string_length = 0;
    errorTitle.field_2._M_local_buf[0] = '\0';
    clickPrompt.field_2._M_local_buf[0] = '\0';
    if (errorFatal == '\x01') {
      std::__cxx11::string::assign((char *)&errorTitle);
      std::__cxx11::string::assign((char *)&clickPrompt);
    }
    else {
      std::__cxx11::string::assign((char *)&errorTitle);
      std::__cxx11::string::assign((char *)&clickPrompt);
    }
    bVar2 = HDPI;
    glBegin(7);
    glColor4f();
    glVertex2f(0,0);
    auVar19._8_8_ = extraout_XMM1_Qb;
    auVar19._0_8_ = extraout_XMM1_Qa;
    auVar20._4_12_ = auVar19._4_12_;
    auVar20._0_4_ = (float)CONCAT44(buffer_h._4_4_,(undefined4)buffer_h);
    auVar28 = glVertex2f(0,auVar20._0_8_);
    auVar21._0_8_ = auVar28._8_8_;
    auVar11._0_8_ = auVar28._0_8_;
    auVar21._8_8_ = extraout_XMM1_Qb_00;
    auVar11._8_8_ = extraout_XMM0_Qb;
    auVar12._4_12_ = auVar11._4_12_;
    auVar12._0_4_ = (float)CONCAT44(buffer_w._4_4_,(undefined4)buffer_w);
    auVar22._4_12_ = auVar21._4_12_;
    if (buffer_h._4_4_ < 0) {
      auVar23._0_4_ = (float)CONCAT44(buffer_h._4_4_,(undefined4)buffer_h);
      auVar23._4_12_ = auVar22._4_12_;
      uVar18 = auVar23._0_8_;
    }
    else {
      auVar22._0_4_ = (float)(long)CONCAT44(buffer_h._4_4_,(undefined4)buffer_h);
      uVar18 = auVar22._0_8_;
    }
    auVar13._0_8_ = glVertex2f(auVar12._0_8_,uVar18);
    auVar13._8_8_ = extraout_XMM0_Qb_00;
    auVar14._4_12_ = auVar13._4_12_;
    auVar14._0_4_ = (float)CONCAT44(buffer_w._4_4_,(undefined4)buffer_w);
    glVertex2f(auVar14._0_8_);
    uVar1 = CONCAT44(buffer_w._4_4_,(undefined4)buffer_w);
    uVar8 = CONCAT44(buffer_h._4_4_,(undefined4)buffer_h) / 6;
    glColor4f();
    glVertex2f();
    glVertex2f();
    glVertex2f();
    glVertex2f();
    glEnd();
    pOVar6 = osd_text;
    iVar7 = buffer_h._4_4_;
    uVar5 = (undefined4)buffer_h;
    uVar4 = buffer_w._4_4_;
    uVar3 = (undefined4)buffer_w;
    auVar15._4_4_ = buffer_w._4_4_;
    auVar15._0_4_ = (undefined4)buffer_w;
    auVar24._4_4_ = buffer_h._4_4_;
    auVar24._0_4_ = (undefined4)buffer_h;
    std::__cxx11::string::string((string *)&local_50,(string *)&errorTitle);
    dVar27 = (double)(long)((ulong)bVar2 * 0x20 + uVar1 / 6 + 0x20);
    dVar27 = dVar27 + dVar27;
    lVar9 = uVar8 + 0x30;
    if (bVar2 != 0) {
      lVar9 = uVar8 + 0x60;
    }
    auVar24._8_4_ = iVar7;
    auVar24._12_4_ = 0x45300000;
    auVar15._8_4_ = uVar4;
    auVar15._12_4_ = 0x45300000;
    color.b = 1.0;
    color.a = 1.0;
    color.r = 1.0;
    color.g = 1.0;
    line_id = OSDText::add_line(pOVar6,(float)(dVar27 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                                        ((double)CONCAT44(0x43300000,uVar3) -
                                                        4503599627370496.0)) + -1.0),
                                (float)(1.0 - ((double)lVar9 + (double)lVar9) /
                                              ((auVar24._8_8_ - 1.9342813113834067e+25) +
                                              ((double)CONCAT44(0x43300000,uVar5) -
                                              4503599627370496.0))),&local_50,0x20,color);
    std::__cxx11::string::~string((string *)&local_50);
    pOVar6 = osd_text;
    iVar7 = buffer_h._4_4_;
    uVar5 = (undefined4)buffer_h;
    uVar4 = buffer_w._4_4_;
    uVar3 = (undefined4)buffer_w;
    auVar16._4_4_ = buffer_w._4_4_;
    auVar16._0_4_ = (undefined4)buffer_w;
    auVar25._4_4_ = buffer_h._4_4_;
    auVar25._0_4_ = (undefined4)buffer_h;
    std::__cxx11::string::string((string *)&local_70,(string *)errorMessage_abi_cxx11_);
    lVar9 = uVar8 + 0x60;
    if (bVar2 != 0) {
      lVar9 = uVar8 + 0xc0;
    }
    auVar25._8_4_ = iVar7;
    auVar25._12_4_ = 0x45300000;
    auVar16._8_4_ = uVar4;
    auVar16._12_4_ = 0x45300000;
    color_00.b = 1.0;
    color_00.a = 1.0;
    color_00.r = 1.0;
    color_00.g = 1.0;
    line_id_00 = OSDText::add_line(pOVar6,(float)(dVar27 / ((auVar16._8_8_ - 1.9342813113834067e+25)
                                                           + ((double)CONCAT44(0x43300000,uVar3) -
                                                             4503599627370496.0)) + -1.0),
                                   (float)(1.0 - ((double)lVar9 + (double)lVar9) /
                                                 ((auVar25._8_8_ - 1.9342813113834067e+25) +
                                                 ((double)CONCAT44(0x43300000,uVar5) -
                                                 4503599627370496.0))),&local_70,0x20,color_00);
    std::__cxx11::string::~string((string *)&local_70);
    pOVar6 = osd_text;
    iVar7 = buffer_h._4_4_;
    uVar5 = (undefined4)buffer_h;
    uVar4 = buffer_w._4_4_;
    uVar3 = (undefined4)buffer_w;
    auVar17._4_4_ = buffer_w._4_4_;
    auVar17._0_4_ = (undefined4)buffer_w;
    auVar26._4_4_ = buffer_h._4_4_;
    auVar26._0_4_ = (undefined4)buffer_h;
    std::__cxx11::string::string((string *)&local_90,(string *)&clickPrompt);
    lVar9 = uVar8 + 0x120;
    if (bVar2 == 0) {
      lVar9 = uVar8 + 0x90;
    }
    auVar26._8_4_ = iVar7;
    auVar26._12_4_ = 0x45300000;
    auVar17._8_4_ = uVar4;
    auVar17._12_4_ = 0x45300000;
    color_01.b = 1.0;
    color_01.a = 1.0;
    color_01.r = 1.0;
    color_01.g = 1.0;
    iVar7 = OSDText::add_line(pOVar6,(float)(dVar27 / ((auVar17._8_8_ - 1.9342813113834067e+25) +
                                                      ((double)CONCAT44(0x43300000,uVar3) -
                                                      4503599627370496.0)) + -1.0),
                              (float)(1.0 - ((double)lVar9 + (double)lVar9) /
                                            ((auVar26._8_8_ - 1.9342813113834067e+25) +
                                            ((double)CONCAT44(0x43300000,uVar5) - 4503599627370496.0
                                            ))),&local_90,0x10,color_01);
    std::__cxx11::string::~string((string *)&local_90);
    OSDText::render(osd_text);
    OSDText::del_line(osd_text,line_id);
    OSDText::del_line(osd_text,line_id_00);
    OSDText::del_line(osd_text,iVar7);
    glMatrixMode(0x1701);
    glPopMatrix();
    glMatrixMode(0x1700);
    glPopMatrix();
    glPopAttrib();
    glEnable(0xb71);
    glEnable(0xb50);
    std::__cxx11::string::~string((string *)&clickPrompt);
    std::__cxx11::string::~string((string *)&errorTitle);
  }
  return;
}

Assistant:

void Viewer::drawError() {

    if( !showingError) {
        return;
    }
   
    printf("Showing Error! *******************\n");

    // GL prep
    // Note: This was copied in, I think it's a bit overkill
    glPushAttrib(GL_VIEWPORT_BIT);
    glViewport(0, 0, buffer_w, buffer_h);
    glMatrixMode(GL_PROJECTION);
    glPushMatrix();
    glLoadIdentity();
    glOrtho(0, buffer_w, buffer_h, 0, 0, 1);
    glMatrixMode(GL_MODELVIEW);
    glPushMatrix();
    glLoadIdentity();
    glTranslatef(0, 0, -1);
    glDisable(GL_DEPTH_TEST);
    glDisable(GL_LIGHTING);
    
    // Style based on error type
    std::string errorTitle;
    std::string clickPrompt;
    Color errorColor;
    if(errorFatal) {
        errorColor = Color(.85, .3, .3);
        errorTitle = "FATAL ERROR";
        clickPrompt = "Click anywhere to exit.";
    } else { 
        errorColor = Color(1.0, .65, .2);
        errorTitle = "ERROR";
        clickPrompt = "Click anywhere to dismiss.";
    }

    // == Draw the error overlay
    int textSize = 16;
    int textHeight = HDPI ? 2*textSize : textSize;
    glBegin(GL_QUADS);

    // Gray out the background
    glColor4f(.5, .5, .5, .8);
    glVertex2f(0,0);
    glVertex2f(0,buffer_h);
    glVertex2f(buffer_w, buffer_h);
    glVertex2f(buffer_w, 0);

    // Draw a scary red box
    size_t boxHeight = 11*textHeight;
    boxHeight = std::min(boxHeight, 2*buffer_h/3);
    size_t boxWidth = 2*buffer_w/3;
    size_t boxX0 = buffer_w/6;
    size_t boxY0 = buffer_h/6;
    glColor4f(errorColor.r, errorColor.g, errorColor.b, 0.8);
    glVertex2f(boxX0 + boxWidth, boxY0);
    glVertex2f(boxX0 + boxWidth, boxY0 + boxHeight);
    glVertex2f(boxX0, boxY0 + boxHeight);
    glVertex2f(boxX0, boxY0);

    glEnd();
    
    // == Draw the text
    // Note that the coordinates in each command are transformed to the [-1,1] coordinates used in OSDText.

    int id1 = osd_text->add_line(2.0*(boxX0 + 2*textHeight)/buffer_w - 1.0,
                                -2.0*(boxY0 + 3*textHeight)/buffer_h + 1.0, 
                                 errorTitle, 2*textSize, Color(1,1,1));
    int id2 = osd_text->add_line(2.0*(boxX0 + 2*textHeight)/buffer_w - 1.0,
                                -2.0*(boxY0 + 6*textHeight)/buffer_h + 1.0, 
                                 errorMessage, 2*textSize, Color(1,1,1));
    int id3 = osd_text->add_line(2.0*(boxX0 + 2*textHeight)/buffer_w - 1.0,
                                -2.0*(boxY0 + 9*textHeight)/buffer_h + 1.0, 
                                 clickPrompt, textSize, Color(1,1,1));
    
    osd_text->render();
    osd_text->del_line(id1);
    osd_text->del_line(id2);
    osd_text->del_line(id3);

    // GL cleanup
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glPopAttrib();
    glEnable(GL_DEPTH_TEST);
    glEnable(GL_LIGHTING);
}